

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O0

Located<kj::Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_>_> * __thiscall
capnp::compiler::anon_unknown_0::
ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&>
::operator()(Located<kj::Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_>_>
             *__return_storage_ptr__,
            ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&>
            *this,Located<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader>
                  *items)

{
  uint uVar1;
  uint uVar2;
  ErrorReporter *pEVar3;
  undefined4 uVar4;
  bool bVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_> *pMVar9;
  Reader *pRVar10;
  Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_> *value;
  size_t size;
  Iterator IVar11;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  IVar12;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  end;
  StringPtr local_2f8;
  StringPtr local_2e8;
  Reader *local_2d8;
  uint local_2d0;
  Reader *local_2c8;
  uint local_2c0;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_2b8;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_2a8;
  TemporaryPointer<capnp::compiler::Token::Reader> local_298;
  Reader *local_268;
  uint local_260;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_258;
  TemporaryPointer<capnp::compiler::Token::Reader> local_248;
  StringPtr local_218;
  Reader *local_208;
  uint local_200;
  Reader *local_1f8;
  uint local_1f0;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_1e8;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_1d8;
  TemporaryPointer<capnp::compiler::Token::Reader> local_1c8;
  TemporaryPointer<capnp::compiler::Token::Reader> local_198;
  Reader *local_168;
  uint local_160;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  local_158;
  Reader *local_148;
  uint local_140;
  undefined1 local_138 [8];
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  best;
  Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_> local_120;
  Reader *local_f8;
  uint local_f0;
  Reader *local_e8;
  uint local_e0;
  Reader *local_d8;
  uint local_d0;
  Reader *local_c8;
  uint local_c0;
  undefined1 local_b8 [8];
  ParserInput input;
  undefined1 local_70 [8];
  Reader item;
  undefined1 local_38 [4];
  uint i;
  Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_> result;
  Located<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader>
  *items_local;
  ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&>
  *this_local;
  
  result.disposer = (ArrayDisposer *)items;
  uVar6 = List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader::size
                    (&items->value);
  kj::heapArray<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>>>
            ((Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_> *)local_38,
             (kj *)(ulong)uVar6,size);
  for (item.reader._44_4_ = 0; uVar4 = item.reader._44_4_,
      uVar6 = List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader::
              size((Reader *)result.disposer), (uint)uVar4 < uVar6;
      item.reader._44_4_ = item.reader._44_4_ + 1) {
    List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader::operator[]
              ((Reader *)local_70,(Reader *)result.disposer,item.reader._44_4_);
    IVar11 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::begin((Reader *)local_70);
    local_d8 = IVar11.container;
    local_d0 = IVar11.index;
    local_c8 = local_d8;
    local_c0 = local_d0;
    IVar11 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end((Reader *)local_70);
    local_f8 = IVar11.container;
    local_f0 = IVar11.index;
    IVar12.index = local_c0;
    IVar12.container = local_c8;
    IVar12._12_4_ = 0;
    end._12_4_ = 0;
    end.container = (Reader *)SUB128(IVar11._0_12_,0);
    end.index = SUB124(IVar11._0_12_,8);
    local_e8 = local_f8;
    local_e0 = local_f0;
    kj::parse::
    IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
    ::IteratorInput((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                     *)local_b8,IVar12,end);
    kj::parse::
    Sequence_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&,_const_kj::parse::EndOfInput__&>
    ::
    operator()<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>_>
              (&local_120,&this->itemParser,
               (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                *)local_b8);
    pMVar9 = kj::Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_>::operator[]
                       ((Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_> *)
                        local_38,(ulong)(uint)item.reader._44_4_);
    kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>::operator=(pMVar9,&local_120);
    kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>::~Maybe(&local_120);
    pMVar9 = kj::Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_>::operator[]
                       ((Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_> *)
                        local_38,(ulong)(uint)item.reader._44_4_);
    bVar5 = kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>::operator==(pMVar9);
    if (bVar5) {
      IVar12 = kj::parse::
               IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
               ::getBest((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                          *)local_b8);
      local_148 = IVar12.container;
      local_140 = IVar12.index;
      local_138 = (undefined1  [8])local_148;
      best.container._0_4_ = local_140;
      IVar11 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end((Reader *)local_70);
      local_168 = IVar11.container;
      local_160 = IVar11.index;
      local_158.container = local_168;
      local_158.index = local_160;
      bVar5 = capnp::_::
              IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
              ::operator<((IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                           *)local_138,&local_158);
      if (bVar5) {
        pEVar3 = this->errorReporter;
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
        ::operator->(&local_198,
                     (IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                      *)local_138);
        pRVar10 = capnp::_::TemporaryPointer<capnp::compiler::Token::Reader>::operator->(&local_198)
        ;
        uVar7 = Token::Reader::getStartByte(pRVar10);
        IVar11 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end((Reader *)local_70);
        local_1f8 = IVar11.container;
        local_1f0 = IVar11.index;
        local_1e8.container = local_1f8;
        local_1e8.index = local_1f0;
        IVar12 = capnp::_::
                 IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                 ::operator-(&local_1e8,1);
        local_208 = IVar12.container;
        local_200 = IVar12.index;
        local_1d8.container = local_208;
        local_1d8.index = local_200;
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
        ::operator->(&local_1c8,&local_1d8);
        pRVar10 = capnp::_::TemporaryPointer<capnp::compiler::Token::Reader>::operator->(&local_1c8)
        ;
        uVar8 = Token::Reader::getEndByte(pRVar10);
        kj::StringPtr::StringPtr(&local_218,"Parse error.");
        (**pEVar3->_vptr_ErrorReporter)
                  (pEVar3,(ulong)uVar7,(ulong)uVar8,local_218.content.ptr,local_218.content.size_);
      }
      else {
        uVar6 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::size((Reader *)local_70);
        if (uVar6 == 0) {
          pEVar3 = this->errorReporter;
          uVar1 = *(uint *)&result.disposer[6]._vptr_ArrayDisposer;
          uVar2 = *(uint *)((long)&result.disposer[6]._vptr_ArrayDisposer + 4);
          kj::StringPtr::StringPtr(&local_2f8,"Parse error: Empty list item.");
          (**pEVar3->_vptr_ErrorReporter)
                    (pEVar3,(ulong)uVar1,(ulong)uVar2,local_2f8.content.ptr,local_2f8.content.size_)
          ;
        }
        else {
          pEVar3 = this->errorReporter;
          IVar11 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::begin((Reader *)local_70);
          local_268 = IVar11.container;
          local_260 = IVar11.index;
          local_258.container = local_268;
          local_258.index = local_260;
          capnp::_::
          IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
          ::operator->(&local_248,&local_258);
          pRVar10 = capnp::_::TemporaryPointer<capnp::compiler::Token::Reader>::operator->
                              (&local_248);
          uVar7 = Token::Reader::getStartByte(pRVar10);
          IVar11 = List<capnp::compiler::Token,_(capnp::Kind)3>::Reader::end((Reader *)local_70);
          local_2c8 = IVar11.container;
          local_2c0 = IVar11.index;
          local_2b8.container = local_2c8;
          local_2b8.index = local_2c0;
          IVar12 = capnp::_::
                   IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                   ::operator-(&local_2b8,1);
          local_2d8 = IVar12.container;
          local_2d0 = IVar12.index;
          local_2a8.container = local_2d8;
          local_2a8.index = local_2d0;
          capnp::_::
          IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
          ::operator->(&local_298,&local_2a8);
          pRVar10 = capnp::_::TemporaryPointer<capnp::compiler::Token::Reader>::operator->
                              (&local_298);
          uVar8 = Token::Reader::getEndByte(pRVar10);
          kj::StringPtr::StringPtr(&local_2e8,"Parse error.");
          (**pEVar3->_vptr_ErrorReporter)
                    (pEVar3,(ulong)uVar7,(ulong)uVar8,local_2e8.content.ptr,local_2e8.content.size_)
          ;
        }
      }
    }
    kj::parse::
    IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
    ::~IteratorInput((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                      *)local_b8);
  }
  value = kj::mv<kj::Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>>>>
                    ((Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_> *)
                     local_38);
  Located<kj::Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_>_>::Located
            (__return_storage_ptr__,value,*(uint32_t *)&result.disposer[6]._vptr_ArrayDisposer,
             *(uint32_t *)((long)&result.disposer[6]._vptr_ArrayDisposer + 4));
  kj::Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_>::~Array
            ((Array<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Located<kj::Array<kj::Maybe<p::OutputType<ItemParser, CapnpParser::ParserInput>>>> operator()(
      Located<List<List<Token>>::Reader>&& items) const {
    auto result = kj::heapArray<kj::Maybe<p::OutputType<ItemParser, CapnpParser::ParserInput>>>(
        items.value.size());
    for (uint i = 0; i < items.value.size(); i++) {
      auto item = items.value[i];
      CapnpParser::ParserInput input(item.begin(), item.end());
      result[i] = itemParser(input);
      if (result[i] == kj::none) {
        // Parsing failed.  Report an error.
        auto best = input.getBest();
        if (best < item.end()) {
          // Report error from the point where parsing failed to the end of the item.
          errorReporter.addError(
              best->getStartByte(), (item.end() - 1)->getEndByte(), "Parse error.");
        } else if (item.size() > 0) {
          // The item is non-empty and the parser consumed all of it before failing.  Report an
          // error for the whole thing.
          errorReporter.addError(
              item.begin()->getStartByte(), (item.end() - 1)->getEndByte(), "Parse error.");
        } else {
          // The item has no content.
          // TODO(cleanup):  We don't actually know the item's location, so we can only report
          //   an error across the whole list.  Fix this.
          errorReporter.addError(items.startByte, items.endByte, "Parse error: Empty list item.");
        }
      }
    }
    return Located<kj::Array<kj::Maybe<p::OutputType<ItemParser, CapnpParser::ParserInput>>>>(
        kj::mv(result), items.startByte, items.endByte);
  }